

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (action == 1) {
    cameraSpeed = deltaTime * 500.0;
    switch(key) {
    case 0x31:
      curMotion = ONE;
      break;
    case 0x32:
      curMotion = TWO;
      break;
    case 0x33:
      curMotion = THREE;
      break;
    case 0x34:
      curMotion = FOUR;
      break;
    case 0x35:
      curMotion = FIVE;
      break;
    case 0x36:
      curMotion = SIX;
      break;
    case 0x37:
      curMotion = SEVEN;
      break;
    case 0x38:
      bingoFlag = 0;
      cur_passed_time = passed_time;
      curMotion = EIGHT;
      break;
    case 0x39:
      curMotion = NINE;
      break;
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x43:
    case 0x45:
    case 0x46:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
      break;
    case 0x41:
      fVar4 = cameraFront.field_1.y * cameraUp.field_2.z -
              cameraFront.field_2.z * cameraUp.field_1.y;
      fVar2 = cameraFront.field_2.z * cameraUp.field_0.x -
              cameraUp.field_2.z * cameraFront.field_0.x;
      fVar3 = cameraFront.field_0.x * cameraUp.field_1.y -
              cameraFront.field_1.y * cameraUp.field_0.x;
      fVar1 = fVar3 * fVar3 + fVar2 * fVar2 + fVar4 * fVar4;
      if (fVar1 < 0.0) {
        fVar1 = sqrtf(fVar1);
      }
      else {
        fVar1 = SQRT(fVar1);
      }
      fVar1 = 1.0 / fVar1;
      cameraPos.field_0.x = fVar4 * fVar1 * cameraSpeed + cameraPos.field_0.x;
      cameraPos.field_1.y = fVar2 * fVar1 * cameraSpeed + cameraPos.field_1.y;
      cameraPos.field_2.z = fVar3 * fVar1 * cameraSpeed + cameraPos.field_2.z;
      break;
    case 0x42:
      bingoFlag = 0;
      cur_passed_time = passed_time;
      curMotion = BINGO;
      break;
    case 0x44:
      fVar4 = cameraFront.field_1.y * cameraUp.field_2.z -
              cameraFront.field_2.z * cameraUp.field_1.y;
      fVar2 = cameraFront.field_2.z * cameraUp.field_0.x -
              cameraUp.field_2.z * cameraFront.field_0.x;
      fVar3 = cameraFront.field_0.x * cameraUp.field_1.y -
              cameraFront.field_1.y * cameraUp.field_0.x;
      fVar1 = fVar3 * fVar3 + fVar2 * fVar2 + fVar4 * fVar4;
      if (fVar1 < 0.0) {
        fVar1 = sqrtf(fVar1);
      }
      else {
        fVar1 = SQRT(fVar1);
      }
      fVar1 = 1.0 / fVar1;
      cameraPos.field_0.x = cameraPos.field_0.x - fVar4 * fVar1 * cameraSpeed;
      cameraPos.field_1.y = cameraPos.field_1.y - fVar2 * fVar1 * cameraSpeed;
      cameraPos.field_2.z = cameraPos.field_2.z - fVar3 * fVar1 * cameraSpeed;
      break;
    case 0x47:
      curMotion = GRASP;
      break;
    case 0x4f:
      curMotion = OK;
      break;
    case 0x53:
      cameraPos.field_0.x = cameraUp.field_0.x * cameraSpeed + cameraPos.field_0.x;
      cameraPos.field_1.y = cameraUp.field_1.y * cameraSpeed + cameraPos.field_1.y;
      cameraPos.field_2.z = cameraSpeed * cameraUp.field_2.z + cameraPos.field_2.z;
      break;
    case 0x55:
      bingoFlag = 0;
      cur_passed_time = passed_time;
      curMotion = GUN;
      break;
    case 0x56:
      curMotion = WAVE;
      break;
    case 0x57:
      cameraPos.field_0.x = cameraPos.field_0.x - cameraUp.field_0.x * cameraSpeed;
      cameraPos.field_1.y = cameraPos.field_1.y - cameraUp.field_1.y * cameraSpeed;
      cameraPos.field_2.z = cameraPos.field_2.z - cameraSpeed * cameraUp.field_2.z;
      break;
    default:
      if (key == 0x20) {
        if (curMotion == PAUSE) {
          curMotion = motionBeforePause;
        }
        else {
          motionBeforePause = curMotion;
          curMotion = PAUSE;
        }
      }
      else if (key == 0x100) {
        glfwSetWindowShouldClose(window,1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow *window, int key, int scancode, int action, int mods) {
    if(action == GLFW_PRESS){
        cameraSpeed = 500.0f*deltaTime;
        switch(key){
            case GLFW_KEY_ESCAPE:
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            case GLFW_KEY_W://图像向上
                cameraPos -= cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_S://图像向下
                cameraPos += cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_A://图像向左
                cameraPos += glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_D://图像向右
                cameraPos -= glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_G://GRASP
                curMotion = GRASP;
                break;
            case GLFW_KEY_V://WAVE
                curMotion = WAVE;
                break;
            case GLFW_KEY_O://OK
                curMotion = OK;
                break;
            case GLFW_KEY_B://BINGO
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = BINGO;
                break;
            case GLFW_KEY_U://GUN
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = GUN;
                break;
            case GLFW_KEY_1:
                curMotion = ONE;
                break;
            case GLFW_KEY_2:
                curMotion = TWO;
                break;
            case GLFW_KEY_3:
                curMotion = THREE;
                break;
            case GLFW_KEY_4:
                curMotion = FOUR;
                break;
            case GLFW_KEY_5:
                curMotion = FIVE;
                break;
            case GLFW_KEY_6:
                curMotion = SIX;
                break;
            case GLFW_KEY_7:
                curMotion = SEVEN;
                break;
            case GLFW_KEY_8:
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = EIGHT;
                break;
            case GLFW_KEY_9:
                curMotion = NINE;
                break;
            case GLFW_KEY_SPACE:
                if(curMotion != PAUSE) {
                    motionBeforePause = curMotion;
                    curMotion = PAUSE;
                } else{
                    curMotion = motionBeforePause;
                }
            default:
                break;
        }
    }
}